

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

bool __thiscall helics::CommonCore::waitCoreRegistration(CommonCore *this)

{
  BrokerBase *this_00;
  pointer pcVar1;
  string_view message;
  string_view message_00;
  string_view message_01;
  int iVar2;
  size_type in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  int iVar3;
  ulong uVar4;
  ActionMessage *in_RSI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  format_args args;
  string local_108;
  ActionMessage resend;
  
  this_00 = &this->super_BrokerBase;
  iVar2 = (this->super_BrokerBase).global_id._M_i.gid;
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (((iVar2 != -2010000000) && (iVar2 != 0)) && (iVar2 != -1700000000)) {
      return true;
    }
    iVar3 = (int)uVar4;
    if (6 < uVar4) {
      pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      in_RCX = (this->super_BrokerBase).identifier._M_string_length;
      resend.messageAction = (int)(this->super_BrokerBase).brokerState._M_i;
      fmt.size_ = 0x111;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&resend;
      resend.dest_id.gid = iVar2;
      resend.actionTime.internalTimeCode._0_4_ = iVar3;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_108,(v11 *)"broker state={}, broker id={}, sleepcnt={}",fmt,args);
      in_RSI = (ActionMessage *)0x0;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = local_108._M_dataplus._M_p;
      message._M_len = local_108._M_string_length;
      name._M_str = pcVar1;
      name._M_len = in_RCX;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name,message,false);
      std::__cxx11::string::~string((string *)&local_108);
      in_RDX = extraout_RDX;
    }
    if ((this->super_BrokerBase).brokerState._M_i < ~TERMINATING) {
      connect(this,(int)in_RSI,in_RDX,(socklen_t)in_RCX);
    }
    if (CONNECTED_ERROR < (this->super_BrokerBase).brokerState._M_i) break;
    if (iVar3 == 0x14) {
      in_RCX = (this->super_BrokerBase).identifier._M_string_length;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message_01._M_str = "resending reg message";
      message_01._M_len = 0x15;
      name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_01._M_len = in_RCX;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_01,message_01,false);
      ActionMessage::ActionMessage(&resend,cmd_resend);
      resend.messageID = -0x10000028;
      in_RSI = &resend;
      BrokerBase::addActionMessage(this_00,&resend);
      ActionMessage::~ActionMessage(&resend);
    }
    else if (iVar3 == 4) {
      in_RCX = (this->super_BrokerBase).identifier._M_string_length;
      in_RSI = (ActionMessage *)0x0;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message_00._M_str = "now waiting for the core to finish registration before proceeding";
      message_00._M_len = 0x41;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = in_RCX;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_00,message_00,false);
    }
    resend.messageAction = 100;
    resend.messageID = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&resend);
    iVar2 = (this->super_BrokerBase).global_id._M_i.gid;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 100000000;
    in_RDX = extraout_RDX_00;
    if ((this->super_BrokerBase).timeout.internalTimeCode < lVar5) {
      return false;
    }
  }
  return false;
}

Assistant:

bool CommonCore::waitCoreRegistration()
{
    int sleepcnt = 0;
    auto brkid = global_id.load();
    while ((brkid == parent_broker_id) || (!brkid.isValid())) {
        if (sleepcnt > 6) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        fmt::format("broker state={}, broker id={}, sleepcnt={}",
                                    static_cast<int>(getBrokerState()),
                                    brkid.baseValue(),
                                    sleepcnt));
        }
        if (getBrokerState() <= BrokerState::CONFIGURED) {
            connect();
        }
        if (getBrokerState() >= BrokerState::TERMINATING) {
            return false;
        }
        if (sleepcnt == 4) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        "now waiting for the core to finish registration before proceeding");
        }
        if (sleepcnt == 20) {
            LOG_WARNING(parent_broker_id, identifier, "resending reg message");
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        brkid = global_id.load();
        ++sleepcnt;
        if (Time(static_cast<int64_t>(sleepcnt) * 100, time_units::ms) > timeout) {
            return false;
        }
    }
    return true;
}